

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrGeneric<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  byte bVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  JavascriptArrayBuffer *pJVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 *puVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong uVar10;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  ulong uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x231f,"((0))","UNREACHED");
    if (bVar4) {
      *puVar9 = 0;
      return;
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  uVar2 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  uVar10 = (ulong)uVar2;
  switch(playout->ViewType) {
  case TYPE_INT8:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if (uVar2 < uVar5) {
      uVar7 = (uint)*(char *)(CONCAT44(extraout_var_07,iVar6) + uVar10);
    }
    goto LAB_00a6a19d;
  case TYPE_UINT8:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if (uVar2 < uVar5) {
      uVar7 = (uint)*(byte *)(CONCAT44(extraout_var_08,iVar6) + uVar10);
    }
    goto LAB_00a6a19d;
  case TYPE_INT16:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if ((uVar2 & 0xfffffffe) < uVar5) {
      uVar7 = (uint)*(short *)(CONCAT44(extraout_var_04,iVar6) + (ulong)(uVar2 & 0xfffffffe));
    }
    goto LAB_00a6a19d;
  case TYPE_UINT16:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if ((uVar2 & 0xfffffffe) < uVar5) {
      uVar7 = (uint)*(ushort *)(CONCAT44(extraout_var_06,iVar6) + (ulong)(uVar2 & 0xfffffffe));
    }
    goto LAB_00a6a19d;
  default:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if ((uVar2 & 0xfffffffc) < uVar5) {
      uVar7 = *(uint *)(CONCAT44(extraout_var,iVar6) + (ulong)(uVar2 & 0xfffffffc));
    }
LAB_00a6a19d:
    *(uint *)(*(long *)(this + 0x118) + uVar11 * 4) = uVar7;
    return;
  case TYPE_FLOAT32:
    bVar1 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar2 & 0xfffffffc) < uVar7) {
      uVar12 = *(undefined4 *)(CONCAT44(extraout_var_10,iVar6) + (ulong)(uVar2 & 0xfffffffc));
    }
    else {
      uVar12 = 0x7fc00000;
    }
    *(undefined4 *)(*(long *)(this + 0x130) + (ulong)bVar1 * 4) = uVar12;
    return;
  case TYPE_FLOAT64:
    bVar1 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar2 & 0xfffffff8) < uVar7) {
      uVar13 = *(undefined8 *)(CONCAT44(extraout_var_05,iVar6) + (ulong)(uVar2 & 0xfffffff8));
    }
    else {
      uVar13 = 0x7ff8000000000000;
    }
    *(undefined8 *)(*(long *)(this + 0x128) + (ulong)bVar1 * 8) = uVar13;
    return;
  case TYPE_INT64:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar2 & 0xfffffff8) < uVar7) {
      uVar10 = *(ulong *)(CONCAT44(extraout_var_12,iVar6) + (ulong)(uVar2 & 0xfffffff8));
      goto LAB_00a6a2a4;
    }
    break;
  case TYPE_INT8_TO_INT64:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = (ulong)*(char *)(CONCAT44(extraout_var_03,iVar6) + uVar10);
      goto LAB_00a6a2a4;
    }
    break;
  case TYPE_UINT8_TO_INT64:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = (ulong)*(byte *)(CONCAT44(extraout_var_11,iVar6) + uVar10);
      goto LAB_00a6a2a4;
    }
    break;
  case TYPE_INT16_TO_INT64:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar2 & 0xfffffffe) < uVar7) {
      uVar10 = (ulong)*(short *)(CONCAT44(extraout_var_01,iVar6) + (ulong)(uVar2 & 0xfffffffe));
      goto LAB_00a6a2a4;
    }
    break;
  case TYPE_UINT16_TO_INT64:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar2 & 0xfffffffe) < uVar7) {
      uVar10 = (ulong)*(ushort *)(CONCAT44(extraout_var_02,iVar6) + (ulong)(uVar2 & 0xfffffffe));
      goto LAB_00a6a2a4;
    }
    break;
  case TYPE_INT32_TO_INT64:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar2 & 0xfffffffc) < uVar7) {
      uVar10 = (ulong)*(int *)(CONCAT44(extraout_var_09,iVar6) + (ulong)(uVar2 & 0xfffffffc));
      goto LAB_00a6a2a4;
    }
    break;
  case TYPE_UINT32_TO_INT64:
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar2 & 0xfffffffc) < uVar7) {
      uVar10 = (ulong)*(uint *)(CONCAT44(extraout_var_00,iVar6) + (ulong)(uVar2 & 0xfffffffc));
      goto LAB_00a6a2a4;
    }
  }
  uVar10 = 0;
LAB_00a6a2a4:
  *(ulong *)(*(long *)(this + 0x120) + uVar11 * 8) = uVar10;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrGeneric(const unaligned T* playout)
    {
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_LdArr<MemType, RegType>(index & ARRAYBUFFER_VIEW_MASK(align), playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }